

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O0

void __thiscall V2LFO::set(V2LFO *this,syVLFO *para)

{
  uint32_t uVar1;
  int iVar2;
  float fVar3;
  syVLFO *para_local;
  V2LFO *this_local;
  
  this->mode = (int)para->mode;
  this->sync = (int)para->sync != 0;
  this->eg = (int)para->egmode != 0;
  fVar3 = calcfreq(para->rate * 0.0078125);
  this->freq = (int)(fVar3 * 1.0737418e+09);
  uVar1 = ftou32(para->phase * 0.0078125);
  this->cphase = uVar1;
  iVar2 = (int)para->pol;
  if (iVar2 == 0) {
    this->gain = para->amp;
    this->dc = 0.0;
  }
  else if (iVar2 == 1) {
    this->gain = -para->amp;
    this->dc = 0.0;
  }
  else if (iVar2 == 2) {
    this->gain = para->amp;
    this->dc = para->amp * -0.5;
  }
  return;
}

Assistant:

void set(const syVLFO *para)
    {
        mode = (int)para->mode;
        sync = (int)para->sync != 0;
        eg = (int)para->egmode != 0;
        freq = (int)(0.5f * fc32bit * calcfreq(para->rate / 128.0f));
        cphase = ftou32(para->phase / 128.0f);

        switch ((int)para->pol)
        {
        case 0: // +
            COVER("LFO pol +");
            gain = para->amp;
            dc = 0.0f;
            break;

        case 1: // -
            COVER("LFO pol -");
            gain = -para->amp;
            dc = 0.0f;
            break;

        case 2: // +/-
            COVER("LFO pol +/-");
            gain = para->amp;
            dc = -0.5f * para->amp;
            break;
        }
    }